

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_uint64 ma_dr_wav__metadata_process_chunk
                    (ma_dr_wav__metadata_parser *pParser,ma_dr_wav_chunk_header *pChunkHeader,
                    ma_dr_wav_metadata_type allowedMetadataTypes)

{
  char *pcVar1;
  byte bVar2;
  ma_dr_wav_smpl_loop *pmVar3;
  ma_uint8 *pmVar4;
  long lVar5;
  uint uVar6;
  ma_bool32 mVar7;
  size_t sVar8;
  size_t sVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ma_dr_wav_metadata_type type;
  ulong uVar14;
  long lVar15;
  size_t extra;
  ma_dr_wav_metadata *pmVar16;
  ma_uint64 mVar17;
  ma_uint64 mVar18;
  ma_uint64 mVar19;
  bool bVar20;
  char cVar21;
  ma_dr_wav_metadata_location listType;
  ma_uint8 subchunkSizeBuffer [4];
  ma_uint8 acidData [24];
  ma_dr_wav_metadata_location local_15c;
  uint local_158;
  undefined4 local_154;
  undefined4 local_150;
  undefined4 local_14c;
  undefined4 local_148;
  undefined4 local_144;
  undefined4 local_138;
  undefined4 local_134;
  ma_uint32 local_130;
  ma_uint32 local_12c;
  undefined4 local_128;
  ma_uint32 local_124;
  ma_uint32 local_120;
  uint local_11c;
  ma_uint32 local_118;
  undefined1 local_38;
  
  bVar2 = (pChunkHeader->id).fourcc[0];
  switch(bVar2 - 0x61) {
  case 0:
switchD_00164274_caseD_0:
    if ((((pChunkHeader->id).fourcc[1] == 'c') && ((pChunkHeader->id).fourcc[2] == 'i')) &&
       ((pChunkHeader->id).fourcc[3] == 'd')) {
      if (pChunkHeader->sizeInBytes != 0x18) {
        return 0;
      }
      if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
LAB_00164b11:
        pParser->metadataCount = pParser->metadataCount + 1;
        return 0;
      }
      pmVar16 = pParser->pMetadata;
      if (pmVar16 == (ma_dr_wav_metadata *)0x0) {
LAB_00164b19:
        sVar8 = 0;
      }
      else {
        mVar19 = pParser->metadataCursor;
        sVar8 = (*pParser->onRead)(pParser->pReadSeekUserData,&local_138,0x18);
        if (sVar8 == 0x18) {
          pmVar16 = pmVar16 + mVar19;
          pmVar16->type = ma_dr_wav_metadata_type_acid;
          *(uint *)(pmVar16->data).unknown.id = local_138;
          (pmVar16->data).acid.midiUnityNote = (ma_uint16)local_134;
          (pmVar16->data).acid.reserved1 = local_134._2_2_;
          (pmVar16->data).smpl.samplePeriodNanoseconds = local_130;
          (pmVar16->data).smpl.midiUnityNote = local_12c;
          (pmVar16->data).acid.meterDenominator = (ma_uint16)local_128;
          (pmVar16->data).acid.meterNumerator = local_128._2_2_;
          (pmVar16->data).smpl.smpteFormat = local_124;
        }
      }
LAB_00164b1c:
      if (sVar8 != pChunkHeader->sizeInBytes) {
        return sVar8;
      }
      goto LAB_00164b22;
    }
    if (bVar2 < 99) {
      if (bVar2 == 0x4c) goto LAB_001646e2;
LAB_00164664:
      if (bVar2 != 0x62) goto switchD_00164274_caseD_3;
      goto switchD_00164274_caseD_1;
    }
    if (bVar2 != 0x6c) {
      if (bVar2 != 99) goto switchD_00164274_caseD_3;
      goto switchD_00164274_caseD_2;
    }
    break;
  case 1:
switchD_00164274_caseD_1:
    if ((((pChunkHeader->id).fourcc[1] == 'e') && ((pChunkHeader->id).fourcc[2] == 'x')) &&
       ((pChunkHeader->id).fourcc[3] == 't')) {
      if (pChunkHeader->sizeInBytes < 0x25a) {
        return 0;
      }
      if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
        local_38 = 0;
        sVar8 = (*pParser->onRead)(pParser->pReadSeekUserData,&local_138,0x100);
        if (sVar8 != 0x100) {
          return sVar8;
        }
        if ((ma_uint8)local_138 == '\0') {
          lVar15 = -0x217;
        }
        else {
          lVar11 = -0x217;
          do {
            lVar15 = lVar11 + 1;
            pcVar1 = &stack0x000000e0 + lVar11;
            lVar11 = lVar15;
          } while (*pcVar1 != '\0');
        }
        local_118 = local_118 & 0xffffff00;
        sVar8 = (*pParser->onRead)(pParser->pReadSeekUserData,&local_138,0x20);
        if (sVar8 == 0x20) {
          if ((ma_uint8)local_138 == '\0') {
            lVar11 = 0;
          }
          else {
            lVar12 = 0;
            do {
              lVar11 = lVar12 + 1;
              lVar13 = lVar12 + 1;
              lVar12 = lVar11;
            } while (*(char *)((long)&local_138 + lVar13) != '\0');
          }
          local_118 = local_118 & 0xffffff00;
          sVar9 = (*pParser->onRead)(pParser->pReadSeekUserData,&local_138,0x20);
          mVar19 = sVar8 + 0x100 + sVar9;
          if (sVar9 == 0x20) {
            if ((ma_uint8)local_138 == '\0') {
              lVar12 = 0;
            }
            else {
              lVar13 = 0;
              do {
                lVar12 = lVar13 + 1;
                lVar5 = lVar13 + 1;
                lVar13 = lVar12;
              } while (*(char *)((long)&local_138 + lVar5) != '\0');
            }
            pParser->extraCapacity =
                 pParser->extraCapacity + lVar15 + lVar11 + lVar12 + pChunkHeader->sizeInBytes;
            pParser->metadataCount = pParser->metadataCount + 1;
            return mVar19;
          }
          return mVar19;
        }
        return sVar8 + 0x100;
      }
      sVar8 = ma_dr_wav__read_bext_to_metadata_obj
                        (pParser,pParser->pMetadata + pParser->metadataCursor,
                         pChunkHeader->sizeInBytes);
LAB_001646ae:
      if (sVar8 != pChunkHeader->sizeInBytes) {
        return sVar8;
      }
LAB_00164b22:
      pParser->metadataCursor = pParser->metadataCursor + 1;
      return sVar8;
    }
    if (bVar2 != 0x6c) goto switchD_0016452e_default;
    break;
  case 2:
switchD_00164274_caseD_2:
    if ((((pChunkHeader->id).fourcc[1] == 'u') && ((pChunkHeader->id).fourcc[2] == 'e')) &&
       ((pChunkHeader->id).fourcc[3] == ' ')) {
      uVar14 = pChunkHeader->sizeInBytes;
      if (uVar14 < 4) {
        return 0;
      }
      if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
        pParser->metadataCount = pParser->metadataCount + 1;
        pParser->extraCapacity =
             ~((((uVar14 - 4) / 3 & 0xfffffffffffffff8) * -3 + uVar14) - 4) + uVar14 +
             pParser->extraCapacity + 4;
        return 0;
      }
      sVar8 = ma_dr_wav__read_cue_to_metadata_obj
                        (pParser,pChunkHeader,pParser->pMetadata + pParser->metadataCursor);
      goto LAB_001646ae;
    }
    if (bVar2 == 0x4c) goto LAB_001646e2;
    if (bVar2 != 0x6c) goto LAB_00164664;
    break;
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 9:
  case 10:
    goto switchD_00164274_caseD_3;
  case 8:
switchD_00164274_caseD_8:
    if ((((pChunkHeader->id).fourcc[1] == 'n') && ((pChunkHeader->id).fourcc[2] == 's')) &&
       ((pChunkHeader->id).fourcc[3] == 't')) {
      if (pChunkHeader->sizeInBytes != 7) {
        return 0;
      }
      if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) goto LAB_00164b11;
      pmVar16 = pParser->pMetadata;
      if (pmVar16 == (ma_dr_wav_metadata *)0x0) goto LAB_00164b19;
      mVar19 = pParser->metadataCursor;
      sVar8 = (*pParser->onRead)(pParser->pReadSeekUserData,&local_138,7);
      if (sVar8 == 7) {
        pmVar16 = pmVar16 + mVar19;
        pmVar16->type = ma_dr_wav_metadata_type_inst;
        (pmVar16->data).inst.midiUnityNote = (ma_uint8)local_138;
        (pmVar16->data).inst.fineTuneCents = local_138._1_1_;
        (pmVar16->data).inst.gainDecibels = local_138._2_1_;
        (pmVar16->data).inst.lowNote = local_138._3_1_;
        (pmVar16->data).inst.highNote = (ma_int8)local_134;
        (pmVar16->data).inst.lowVelocity = local_134._1_1_;
        (pmVar16->data).inst.highVelocity = local_134._2_1_;
      }
      goto LAB_00164b1c;
    }
    if (bVar2 < 0x62) {
      if (bVar2 == 0x4c) goto LAB_001646e2;
      if (bVar2 != 0x61) goto switchD_00164274_caseD_3;
      goto switchD_00164274_caseD_0;
    }
    if (bVar2 == 0x62) goto switchD_00164274_caseD_1;
    if (bVar2 == 99) goto switchD_00164274_caseD_2;
    goto LAB_001646f7;
  case 0xb:
    break;
  default:
    if (bVar2 != 0x4c) {
      if (bVar2 != 0x73) goto switchD_00164274_caseD_3;
      if ((((pChunkHeader->id).fourcc[1] == 'm') && ((pChunkHeader->id).fourcc[2] == 'p')) &&
         ((pChunkHeader->id).fourcc[3] == 'l')) {
        if (pChunkHeader->sizeInBytes < 0x24) {
          return 0;
        }
        if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
          mVar7 = (*pParser->onSeek)(pParser->pReadSeekUserData,0x1c,ma_dr_wav_seek_origin_current);
          if (mVar7 == 0) {
            mVar19 = 0;
          }
          else {
            sVar8 = (*pParser->onRead)(pParser->pReadSeekUserData,&local_138,4);
            mVar19 = sVar8 + 0x1c;
            if ((sVar8 == 4) &&
               (uVar14 = (ulong)local_138, (pChunkHeader->sizeInBytes - 0x24) / 0x18 == uVar14)) {
              sVar8 = (*pParser->onRead)(pParser->pReadSeekUserData,&local_138,4);
              mVar19 = mVar19 + sVar8;
              if (sVar8 == 4) {
                pParser->metadataCount = pParser->metadataCount + 1;
                pParser->extraCapacity =
                     (ulong)local_138 + uVar14 * 0x18 + pParser->extraCapacity + 7;
              }
            }
          }
          if (mVar7 == 0) {
            return 0;
          }
          return mVar19;
        }
        pmVar16 = pParser->pMetadata;
        if (pmVar16 == (ma_dr_wav_metadata *)0x0) goto LAB_00164b19;
        mVar19 = pParser->metadataCursor;
        sVar8 = (*pParser->onRead)(pParser->pReadSeekUserData,&local_138,0x24);
        if (sVar8 == 0x24) {
          pmVar16 = pmVar16 + mVar19;
          pmVar16->type = ma_dr_wav_metadata_type_smpl;
          *(uint *)(pmVar16->data).unknown.id = local_138;
          (pmVar16->data).smpl.productId = local_134;
          (pmVar16->data).smpl.samplePeriodNanoseconds = local_130;
          (pmVar16->data).smpl.midiUnityNote = local_12c;
          (pmVar16->data).smpl.midiPitchFraction = local_128;
          (pmVar16->data).smpl.smpteFormat = local_124;
          (pmVar16->data).smpl.smpteOffset = local_120;
          (pmVar16->data).smpl.sampleLoopCount = local_11c;
          (pmVar16->data).smpl.samplerSpecificDataSizeInBytes = local_118;
          if ((pChunkHeader->sizeInBytes - 0x24) / 0x18 == (ulong)local_11c) {
            uVar14 = (ulong)pParser->pDataCursor & 7;
            if (uVar14 != 0) {
              pParser->pDataCursor = pParser->pDataCursor + (8 - uVar14);
            }
            pmVar3 = (ma_dr_wav_smpl_loop *)pParser->pDataCursor;
            pParser->pDataCursor = (ma_uint8 *)(pmVar3 + local_11c);
            (pmVar16->data).smpl.pLoops = pmVar3;
            if ((pmVar16->data).smpl.sampleLoopCount != 0) {
              lVar15 = 0;
              uVar14 = 0;
              sVar8 = 0x24;
              do {
                sVar9 = (*pParser->onRead)(pParser->pReadSeekUserData,&local_158,0x18);
                sVar8 = sVar8 + sVar9;
                if (sVar9 != 0x18) break;
                *(uint *)((long)&((pmVar16->data).smpl.pLoops)->cuePointId + lVar15) = local_158;
                *(undefined4 *)((long)&((pmVar16->data).smpl.pLoops)->type + lVar15) = local_154;
                *(undefined4 *)
                 ((long)&((pmVar16->data).smpl.pLoops)->firstSampleByteOffset + lVar15) = local_150;
                *(undefined4 *)((long)&((pmVar16->data).smpl.pLoops)->lastSampleByteOffset + lVar15)
                     = local_14c;
                *(undefined4 *)((long)&((pmVar16->data).smpl.pLoops)->sampleFraction + lVar15) =
                     local_148;
                *(undefined4 *)((long)&((pmVar16->data).smpl.pLoops)->playCount + lVar15) =
                     local_144;
                uVar14 = uVar14 + 1;
                lVar15 = lVar15 + 0x18;
              } while (uVar14 < (pmVar16->data).smpl.sampleLoopCount);
            }
            uVar14 = (ulong)(pmVar16->data).smpl.samplerSpecificDataSizeInBytes;
            if (uVar14 != 0) {
              pmVar4 = pParser->pDataCursor;
              pParser->pDataCursor = pmVar4 + uVar14;
              (pmVar16->data).smpl.pSamplerSpecificData = pmVar4;
              sVar9 = (*pParser->onRead)(pParser->pReadSeekUserData,pmVar4,
                                         (size_t)(pmVar16->data).smpl.samplerSpecificDataSizeInBytes
                                        );
              sVar8 = sVar8 + sVar9;
            }
          }
        }
        goto LAB_00164b1c;
      }
      switch(bVar2 - 0x61) {
      case 0:
        goto switchD_00164274_caseD_0;
      case 1:
        goto switchD_00164274_caseD_1;
      case 2:
        goto switchD_00164274_caseD_2;
      case 3:
      case 4:
      case 5:
      case 6:
      case 7:
      case 9:
      case 10:
        goto switchD_00164274_caseD_3;
      case 8:
        goto switchD_00164274_caseD_8;
      case 0xb:
        goto switchD_00164274_caseD_b;
      }
switchD_0016452e_default:
      if (bVar2 != 0x4c) goto switchD_00164274_caseD_3;
    }
LAB_001646e2:
    if ((((pChunkHeader->id).fourcc[1] == 'I') && ((pChunkHeader->id).fourcc[2] == 'S')) &&
       ((pChunkHeader->id).fourcc[3] == 'T')) goto LAB_00164721;
LAB_001646f7:
    if (bVar2 != 0x6c) goto switchD_00164274_caseD_3;
  }
switchD_00164274_caseD_b:
  if ((((pChunkHeader->id).fourcc[1] == 'i') && ((pChunkHeader->id).fourcc[2] == 's')) &&
     ((pChunkHeader->id).fourcc[3] == 't')) {
LAB_00164721:
    mVar19 = 0;
    local_15c = ma_dr_wav_metadata_location_invalid;
    do {
      if (pChunkHeader->sizeInBytes <= mVar19) {
        return mVar19;
      }
      sVar8 = (*pParser->onRead)(pParser->pReadSeekUserData,&local_138,4);
      mVar17 = mVar19 + sVar8;
      bVar20 = true;
      mVar19 = mVar17;
      if (sVar8 == 4) {
        if (local_138 == 0x6c746461) {
          local_15c = ma_dr_wav_metadata_location_inside_adtl_list;
LAB_00164777:
          bVar20 = false;
          mVar19 = mVar17;
        }
        else if ((((char)local_138 == 'I') && (local_138._1_1_ == 'N')) &&
                ((local_138._2_1_ == 'F' && (local_138._3_1_ == 'O')))) {
          bVar20 = false;
          local_15c = ma_dr_wav_metadata_location_inside_info_list;
        }
        else {
          sVar8 = (*pParser->onRead)(pParser->pReadSeekUserData,&local_158,4);
          uVar6 = local_158;
          mVar18 = mVar17 + sVar8;
          mVar19 = mVar18;
          if (sVar8 == 4) {
            uVar14 = (ulong)local_158;
            cVar21 = (char)local_138;
            if ((local_138 == 0x6c62616c) ||
               ((((cVar21 == 'n' && (local_138._1_1_ == 'o')) && (local_138._2_1_ == 't')) &&
                (local_138._3_1_ == 'e')))) {
              if (3 < local_158) {
                if (pParser->stage != ma_dr_wav__metadata_parser_stage_count) {
                  uVar10 = ma_dr_wav__read_list_label_or_note_to_metadata_obj
                                     (pParser,pParser->pMetadata + pParser->metadataCursor,uVar14,
                                      ((byte)((local_138._3_1_ != 'l' ||
                                              (local_138._2_1_ != 'b' || local_138._1_1_ != 'a')) |
                                             ~-(cVar21 == 'l')) & 1) * 0x40 +
                                      ma_dr_wav_metadata_type_list_label);
                  goto LAB_0016485a;
                }
                pParser->metadataCount = pParser->metadataCount + 1;
                mVar19 = (pParser->extraCapacity + uVar14) - 4;
LAB_001648f1:
                pParser->extraCapacity = mVar19;
              }
LAB_001648f5:
              uVar10 = 0;
            }
            else if ((((bool)(~(cVar21 == 'l') & 1)) || (local_138._1_1_ != 't')) ||
                    ((local_138._2_1_ != 'x' || (local_138._3_1_ != 't')))) {
              if ((((cVar21 == 'I') && (local_138._1_1_ == 'S')) && (local_138._2_1_ == 'F')) &&
                 (local_138._3_1_ == 'T')) {
                type = ma_dr_wav_metadata_type_list_info_software;
              }
              else if ((((cVar21 == 'I') && (local_138._1_1_ == 'C')) && (local_138._2_1_ == 'O'))
                      && (local_138._3_1_ == 'P')) {
                type = ma_dr_wav_metadata_type_list_info_copyright;
              }
              else if (((cVar21 == 'I') && (local_138._1_1_ == 'N')) &&
                      ((local_138._2_1_ == 'A' && (local_138._3_1_ == 'M')))) {
                type = ma_dr_wav_metadata_type_list_info_title;
              }
              else if (((cVar21 == 'I') && (local_138._1_1_ == 'A')) &&
                      ((local_138._2_1_ == 'R' && (local_138._3_1_ == 'T')))) {
                type = ma_dr_wav_metadata_type_list_info_artist;
              }
              else if ((((cVar21 == 'I') && (local_138._1_1_ == 'C')) && (local_138._2_1_ == 'M'))
                      && (local_138._3_1_ == 'T')) {
                type = ma_dr_wav_metadata_type_list_info_comment;
              }
              else if (((cVar21 == 'I') && (local_138._1_1_ == 'C')) &&
                      ((local_138._2_1_ == 'R' && (local_138._3_1_ == 'D')))) {
                type = ma_dr_wav_metadata_type_list_info_date;
              }
              else if (((cVar21 == 'I') && (local_138._1_1_ == 'G')) &&
                      ((local_138._2_1_ == 'N' && (local_138._3_1_ == 'R')))) {
                type = ma_dr_wav_metadata_type_list_info_genre;
              }
              else if ((((cVar21 == 'I') && (local_138._1_1_ == 'P')) && (local_138._2_1_ == 'R'))
                      && (local_138._3_1_ == 'D')) {
                type = ma_dr_wav_metadata_type_list_info_album;
              }
              else {
                if (((cVar21 != 'I') || (local_138._1_1_ != 'T')) ||
                   ((local_138._2_1_ != 'R' || (local_138._3_1_ != 'K')))) {
                  uVar10 = ma_dr_wav__metadata_process_unknown_chunk
                                     (pParser,(ma_uint8 *)&local_138,uVar14,local_15c);
                  goto LAB_00164a5e;
                }
                type = ma_dr_wav_metadata_type_list_info_tracknumber;
              }
              uVar10 = ma_dr_wav__metadata_process_info_text_chunk(pParser,uVar14,type);
            }
            else {
              if (local_158 < 0x14) goto LAB_001648f5;
              if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
                pParser->metadataCount = pParser->metadataCount + 1;
                mVar19 = (pParser->extraCapacity + uVar14) - 0x14;
                goto LAB_001648f1;
              }
              uVar10 = ma_dr_wav__read_list_labelled_cue_region_to_metadata_obj
                                 (pParser,pParser->pMetadata + pParser->metadataCursor,uVar14);
LAB_0016485a:
              if (uVar10 == uVar14) {
                pParser->metadataCursor = pParser->metadataCursor + 1;
              }
            }
LAB_00164a5e:
            mVar19 = uVar10 + mVar18;
            mVar17 = mVar19;
            if (uVar10 < uVar14) {
              mVar7 = (*pParser->onSeek)(pParser->pReadSeekUserData,uVar6 - (int)uVar10,
                                         ma_dr_wav_seek_origin_current);
              bVar20 = mVar7 == 0;
              mVar17 = mVar18 + uVar14;
              if (bVar20) goto LAB_00164ac3;
            }
            if ((uVar6 & 1) == 0) goto LAB_00164777;
            mVar7 = (*pParser->onSeek)(pParser->pReadSeekUserData,1,ma_dr_wav_seek_origin_current);
            bVar20 = mVar7 == 0;
            mVar19 = mVar17 + !bVar20;
          }
        }
      }
LAB_00164ac3:
      if (bVar20) {
        return mVar19;
      }
    } while( true );
  }
switchD_00164274_caseD_3:
  mVar19 = ma_dr_wav__metadata_process_unknown_chunk
                     (pParser,(ma_uint8 *)pChunkHeader,pChunkHeader->sizeInBytes,
                      ma_dr_wav_metadata_location_top_level);
  return mVar19;
}

Assistant:

MA_PRIVATE ma_uint64 ma_dr_wav__metadata_process_chunk(ma_dr_wav__metadata_parser* pParser, const ma_dr_wav_chunk_header* pChunkHeader, ma_dr_wav_metadata_type allowedMetadataTypes)
{
    const ma_uint8 *pChunkID = pChunkHeader->id.fourcc;
    ma_uint64 bytesRead = 0;
    if (ma_dr_wav__chunk_matches(allowedMetadataTypes, pChunkID, ma_dr_wav_metadata_type_smpl, "smpl")) {
        if (pChunkHeader->sizeInBytes >= MA_DR_WAV_SMPL_BYTES) {
            if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
                ma_uint8 buffer[4];
                size_t bytesJustRead;
                if (!pParser->onSeek(pParser->pReadSeekUserData, 28, ma_dr_wav_seek_origin_current)) {
                    return bytesRead;
                }
                bytesRead += 28;
                bytesJustRead = ma_dr_wav__metadata_parser_read(pParser, buffer, sizeof(buffer), &bytesRead);
                if (bytesJustRead == sizeof(buffer)) {
                    ma_uint32 loopCount = ma_dr_wav_bytes_to_u32(buffer);
                    ma_uint64 calculatedLoopCount;
                    calculatedLoopCount = (pChunkHeader->sizeInBytes - MA_DR_WAV_SMPL_BYTES) / MA_DR_WAV_SMPL_LOOP_BYTES;
                    if (calculatedLoopCount == loopCount) {
                        bytesJustRead = ma_dr_wav__metadata_parser_read(pParser, buffer, sizeof(buffer), &bytesRead);
                        if (bytesJustRead == sizeof(buffer)) {
                            ma_uint32 samplerSpecificDataSizeInBytes = ma_dr_wav_bytes_to_u32(buffer);
                            pParser->metadataCount += 1;
                            ma_dr_wav__metadata_request_extra_memory_for_stage_2(pParser, sizeof(ma_dr_wav_smpl_loop) * loopCount, MA_DR_WAV_METADATA_ALIGNMENT);
                            ma_dr_wav__metadata_request_extra_memory_for_stage_2(pParser, samplerSpecificDataSizeInBytes, 1);
                        }
                    } else {
                    }
                }
            } else {
                bytesRead = ma_dr_wav__read_smpl_to_metadata_obj(pParser, pChunkHeader, &pParser->pMetadata[pParser->metadataCursor]);
                if (bytesRead == pChunkHeader->sizeInBytes) {
                    pParser->metadataCursor += 1;
                } else {
                }
            }
        } else {
        }
    } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, pChunkID, ma_dr_wav_metadata_type_inst, "inst")) {
        if (pChunkHeader->sizeInBytes == MA_DR_WAV_INST_BYTES) {
            if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
                pParser->metadataCount += 1;
            } else {
                bytesRead = ma_dr_wav__read_inst_to_metadata_obj(pParser, &pParser->pMetadata[pParser->metadataCursor]);
                if (bytesRead == pChunkHeader->sizeInBytes) {
                    pParser->metadataCursor += 1;
                } else {
                }
            }
        } else {
        }
    } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, pChunkID, ma_dr_wav_metadata_type_acid, "acid")) {
        if (pChunkHeader->sizeInBytes == MA_DR_WAV_ACID_BYTES) {
            if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
                pParser->metadataCount += 1;
            } else {
                bytesRead = ma_dr_wav__read_acid_to_metadata_obj(pParser, &pParser->pMetadata[pParser->metadataCursor]);
                if (bytesRead == pChunkHeader->sizeInBytes) {
                    pParser->metadataCursor += 1;
                } else {
                }
            }
        } else {
        }
    } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, pChunkID, ma_dr_wav_metadata_type_cue, "cue ")) {
        if (pChunkHeader->sizeInBytes >= MA_DR_WAV_CUE_BYTES) {
            if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
                size_t cueCount;
                pParser->metadataCount += 1;
                cueCount = (size_t)(pChunkHeader->sizeInBytes - MA_DR_WAV_CUE_BYTES) / MA_DR_WAV_CUE_POINT_BYTES;
                ma_dr_wav__metadata_request_extra_memory_for_stage_2(pParser, sizeof(ma_dr_wav_cue_point) * cueCount, MA_DR_WAV_METADATA_ALIGNMENT);
            } else {
                bytesRead = ma_dr_wav__read_cue_to_metadata_obj(pParser, pChunkHeader, &pParser->pMetadata[pParser->metadataCursor]);
                if (bytesRead == pChunkHeader->sizeInBytes) {
                    pParser->metadataCursor += 1;
                } else {
                }
            }
        } else {
        }
    } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, pChunkID, ma_dr_wav_metadata_type_bext, "bext")) {
        if (pChunkHeader->sizeInBytes >= MA_DR_WAV_BEXT_BYTES) {
            if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
                char buffer[MA_DR_WAV_BEXT_DESCRIPTION_BYTES + 1];
                size_t allocSizeNeeded = MA_DR_WAV_BEXT_UMID_BYTES;
                size_t bytesJustRead;
                buffer[MA_DR_WAV_BEXT_DESCRIPTION_BYTES] = '\0';
                bytesJustRead = ma_dr_wav__metadata_parser_read(pParser, buffer, MA_DR_WAV_BEXT_DESCRIPTION_BYTES, &bytesRead);
                if (bytesJustRead != MA_DR_WAV_BEXT_DESCRIPTION_BYTES) {
                    return bytesRead;
                }
                allocSizeNeeded += ma_dr_wav__strlen(buffer) + 1;
                buffer[MA_DR_WAV_BEXT_ORIGINATOR_NAME_BYTES] = '\0';
                bytesJustRead = ma_dr_wav__metadata_parser_read(pParser, buffer, MA_DR_WAV_BEXT_ORIGINATOR_NAME_BYTES, &bytesRead);
                if (bytesJustRead != MA_DR_WAV_BEXT_ORIGINATOR_NAME_BYTES) {
                    return bytesRead;
                }
                allocSizeNeeded += ma_dr_wav__strlen(buffer) + 1;
                buffer[MA_DR_WAV_BEXT_ORIGINATOR_REF_BYTES] = '\0';
                bytesJustRead = ma_dr_wav__metadata_parser_read(pParser, buffer, MA_DR_WAV_BEXT_ORIGINATOR_REF_BYTES, &bytesRead);
                if (bytesJustRead != MA_DR_WAV_BEXT_ORIGINATOR_REF_BYTES) {
                    return bytesRead;
                }
                allocSizeNeeded += ma_dr_wav__strlen(buffer) + 1;
                allocSizeNeeded += (size_t)pChunkHeader->sizeInBytes - MA_DR_WAV_BEXT_BYTES;
                ma_dr_wav__metadata_request_extra_memory_for_stage_2(pParser, allocSizeNeeded, 1);
                pParser->metadataCount += 1;
            } else {
                bytesRead = ma_dr_wav__read_bext_to_metadata_obj(pParser, &pParser->pMetadata[pParser->metadataCursor], pChunkHeader->sizeInBytes);
                if (bytesRead == pChunkHeader->sizeInBytes) {
                    pParser->metadataCursor += 1;
                } else {
                }
            }
        } else {
        }
    } else if (ma_dr_wav_fourcc_equal(pChunkID, "LIST") || ma_dr_wav_fourcc_equal(pChunkID, "list")) {
        ma_dr_wav_metadata_location listType = ma_dr_wav_metadata_location_invalid;
        while (bytesRead < pChunkHeader->sizeInBytes) {
            ma_uint8 subchunkId[4];
            ma_uint8 subchunkSizeBuffer[4];
            ma_uint64 subchunkDataSize;
            ma_uint64 subchunkBytesRead = 0;
            ma_uint64 bytesJustRead = ma_dr_wav__metadata_parser_read(pParser, subchunkId, sizeof(subchunkId), &bytesRead);
            if (bytesJustRead != sizeof(subchunkId)) {
                break;
            }
            if (ma_dr_wav_fourcc_equal(subchunkId, "adtl")) {
                listType = ma_dr_wav_metadata_location_inside_adtl_list;
                continue;
            } else if (ma_dr_wav_fourcc_equal(subchunkId, "INFO")) {
                listType = ma_dr_wav_metadata_location_inside_info_list;
                continue;
            }
            bytesJustRead = ma_dr_wav__metadata_parser_read(pParser, subchunkSizeBuffer, sizeof(subchunkSizeBuffer), &bytesRead);
            if (bytesJustRead != sizeof(subchunkSizeBuffer)) {
                break;
            }
            subchunkDataSize = ma_dr_wav_bytes_to_u32(subchunkSizeBuffer);
            if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_label, "labl") || ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_note, "note")) {
                if (subchunkDataSize >= MA_DR_WAV_LIST_LABEL_OR_NOTE_BYTES) {
                    ma_uint64 stringSizeWithNullTerm = subchunkDataSize - MA_DR_WAV_LIST_LABEL_OR_NOTE_BYTES;
                    if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
                        pParser->metadataCount += 1;
                        ma_dr_wav__metadata_request_extra_memory_for_stage_2(pParser, (size_t)stringSizeWithNullTerm, 1);
                    } else {
                        subchunkBytesRead = ma_dr_wav__read_list_label_or_note_to_metadata_obj(pParser, &pParser->pMetadata[pParser->metadataCursor], subchunkDataSize, ma_dr_wav_fourcc_equal(subchunkId, "labl") ? ma_dr_wav_metadata_type_list_label : ma_dr_wav_metadata_type_list_note);
                        if (subchunkBytesRead == subchunkDataSize) {
                            pParser->metadataCursor += 1;
                        } else {
                        }
                    }
                } else {
                }
            } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_labelled_cue_region, "ltxt")) {
                if (subchunkDataSize >= MA_DR_WAV_LIST_LABELLED_TEXT_BYTES) {
                    ma_uint64 stringSizeWithNullTerminator = subchunkDataSize - MA_DR_WAV_LIST_LABELLED_TEXT_BYTES;
                    if (pParser->stage == ma_dr_wav__metadata_parser_stage_count) {
                        pParser->metadataCount += 1;
                        ma_dr_wav__metadata_request_extra_memory_for_stage_2(pParser, (size_t)stringSizeWithNullTerminator, 1);
                    } else {
                        subchunkBytesRead = ma_dr_wav__read_list_labelled_cue_region_to_metadata_obj(pParser, &pParser->pMetadata[pParser->metadataCursor], subchunkDataSize);
                        if (subchunkBytesRead == subchunkDataSize) {
                            pParser->metadataCursor += 1;
                        } else {
                        }
                    }
                } else {
                }
            } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_info_software, "ISFT")) {
                subchunkBytesRead = ma_dr_wav__metadata_process_info_text_chunk(pParser, subchunkDataSize,  ma_dr_wav_metadata_type_list_info_software);
            } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_info_copyright, "ICOP")) {
                subchunkBytesRead = ma_dr_wav__metadata_process_info_text_chunk(pParser, subchunkDataSize,  ma_dr_wav_metadata_type_list_info_copyright);
            } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_info_title, "INAM")) {
                subchunkBytesRead = ma_dr_wav__metadata_process_info_text_chunk(pParser, subchunkDataSize,  ma_dr_wav_metadata_type_list_info_title);
            } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_info_artist, "IART")) {
                subchunkBytesRead = ma_dr_wav__metadata_process_info_text_chunk(pParser, subchunkDataSize,  ma_dr_wav_metadata_type_list_info_artist);
            } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_info_comment, "ICMT")) {
                subchunkBytesRead = ma_dr_wav__metadata_process_info_text_chunk(pParser, subchunkDataSize,  ma_dr_wav_metadata_type_list_info_comment);
            } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_info_date, "ICRD")) {
                subchunkBytesRead = ma_dr_wav__metadata_process_info_text_chunk(pParser, subchunkDataSize,  ma_dr_wav_metadata_type_list_info_date);
            } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_info_genre, "IGNR")) {
                subchunkBytesRead = ma_dr_wav__metadata_process_info_text_chunk(pParser, subchunkDataSize,  ma_dr_wav_metadata_type_list_info_genre);
            } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_info_album, "IPRD")) {
                subchunkBytesRead = ma_dr_wav__metadata_process_info_text_chunk(pParser, subchunkDataSize,  ma_dr_wav_metadata_type_list_info_album);
            } else if (ma_dr_wav__chunk_matches(allowedMetadataTypes, subchunkId, ma_dr_wav_metadata_type_list_info_tracknumber, "ITRK")) {
                subchunkBytesRead = ma_dr_wav__metadata_process_info_text_chunk(pParser, subchunkDataSize,  ma_dr_wav_metadata_type_list_info_tracknumber);
            } else if ((allowedMetadataTypes & ma_dr_wav_metadata_type_unknown) != 0) {
                subchunkBytesRead = ma_dr_wav__metadata_process_unknown_chunk(pParser, subchunkId, subchunkDataSize, listType);
            }
            bytesRead += subchunkBytesRead;
            MA_DR_WAV_ASSERT(subchunkBytesRead <= subchunkDataSize);
            if (subchunkBytesRead < subchunkDataSize) {
                ma_uint64 bytesToSeek = subchunkDataSize - subchunkBytesRead;
                if (!pParser->onSeek(pParser->pReadSeekUserData, (int)bytesToSeek, ma_dr_wav_seek_origin_current)) {
                    break;
                }
                bytesRead += bytesToSeek;
            }
            if ((subchunkDataSize % 2) == 1) {
                if (!pParser->onSeek(pParser->pReadSeekUserData, 1, ma_dr_wav_seek_origin_current)) {
                    break;
                }
                bytesRead += 1;
            }
        }
    } else if ((allowedMetadataTypes & ma_dr_wav_metadata_type_unknown) != 0) {
        bytesRead = ma_dr_wav__metadata_process_unknown_chunk(pParser, pChunkID, pChunkHeader->sizeInBytes, ma_dr_wav_metadata_location_top_level);
    }
    return bytesRead;
}